

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O1

void __thiscall DIS::FastEntityStatePdu::~FastEntityStatePdu(FastEntityStatePdu *this)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer pAVar3;
  
  (this->super_EntityInformationFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__FastEntityStatePdu_001a0008;
  pAVar1 = (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar3 = pAVar1;
  if (pAVar2 != pAVar1) {
    do {
      (**pAVar3->_vptr_ArticulationParameter)(pAVar3);
      pAVar3 = pAVar3 + 1;
    } while (pAVar3 != pAVar2);
    (this->_articulationParameters).
    super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar1;
  }
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::~vector
            (&this->_articulationParameters);
  EntityInformationFamilyPdu::~EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  return;
}

Assistant:

FastEntityStatePdu::~FastEntityStatePdu()
{
    _articulationParameters.clear();
}